

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O2

string * __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
copyString_abi_cxx11_
          (string *__return_storage_ptr__,
          SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice> *this)

{
  byte bVar1;
  byte *pbVar2;
  Exception *this_00;
  ulong uVar3;
  long lStack_10;
  
  pbVar2 = *(byte **)this;
  bVar1 = *pbVar2;
  if ((byte)(bVar1 - 0x40) < 0x7f) {
    uVar3 = (ulong)(bVar1 - 0x40);
    lStack_10 = 1;
  }
  else {
    if (bVar1 != 0xbf) {
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      Exception::Exception(this_00,InvalidValueType,"Expecting type String");
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
    uVar3 = *(ulong *)(pbVar2 + 1);
    lStack_10 = 9;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pbVar2 + lStack_10,pbVar2 + lStack_10 + uVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string copyString() const {
    uint8_t h = head();
    if (h >= 0x40 && h <= 0xbe) {
      // short UTF-8 String
      ValueLength length = h - 0x40;
      return std::string(reinterpret_cast<char const*>(start() + 1),
                         static_cast<std::size_t>(length));
    }

    if (h == 0xbf) {
      ValueLength length = readIntegerFixed<ValueLength, 8>(start() + 1);
      return std::string(reinterpret_cast<char const*>(start() + 1 + 8),
                         checkOverflow(length));
    }

    throw Exception(Exception::InvalidValueType, "Expecting type String");
  }